

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitRefEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,RefEq *curr)

{
  bool bVar1;
  Literal *pLVar2;
  Literal right;
  undefined1 local_a0 [8];
  Flow flow;
  undefined1 local_40 [8];
  Literal left;
  
  visit((Flow *)local_a0,this,curr->left);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar2 = Flow::getSingleValue((Flow *)local_a0);
    Literal::Literal((Literal *)local_40,pLVar2);
    visit((Flow *)&stack0xffffffffffffff18,this,curr->right);
    Flow::operator=((Flow *)local_a0,(Flow *)&stack0xffffffffffffff18);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff18);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar2 = Flow::getSingleValue((Flow *)local_a0);
      Literal::Literal((Literal *)&stack0xffffffffffffff18,pLVar2);
      bVar1 = Literal::operator==((Literal *)local_40,(Literal *)&stack0xffffffffffffff18);
      flow.breakTo.super_IString.str._M_str._0_4_ = (uint)bVar1;
      Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
      Literal::~Literal((Literal *)&stack0xffffffffffffff18);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
    }
    Literal::~Literal((Literal *)local_40);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefEq(RefEq* curr) {
    NOTE_ENTER("RefEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    return Literal(int32_t(left == right));
  }